

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_SetupBackwardInit(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *Entry;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *vObj;
  int i;
  Abc_Obj_t *pPi;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pLatch;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(100);
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasMapping(pNtk);
    if (iVar1 == 0) {
      pAVar2 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
      pManMR->pInitNtk = pAVar2;
    }
    else {
      pAVar2 = Abc_NtkAlloc(pNtk->ntkType,ABC_FUNC_SOP,1);
      pManMR->pInitNtk = pAVar2;
    }
  }
  else {
    pAVar2 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
    pManMR->pInitNtk = pAVar2;
  }
  for (vObj._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), vObj._4_4_ < iVar1;
      vObj._4_4_ = vObj._4_4_ + 1) {
    pAVar3 = Abc_NtkBox(pNtk,vObj._4_4_);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if (iVar1 != 0) {
      pAVar4 = Abc_NtkCreatePi(pManMR->pInitNtk);
      iVar1 = Abc_LatchIsInit0(pAVar3);
      if (iVar1 == 0) {
        iVar1 = Abc_LatchIsInit1(pAVar3);
        if (iVar1 != 0) {
          Vec_PtrPush(p,pAVar4);
        }
      }
      else {
        Entry = Abc_NtkCreateNodeInv(pManMR->pInitNtk,pAVar4);
        Vec_PtrPush(p,Entry);
      }
      Abc_ObjSetData(pAVar3,pAVar4);
    }
  }
  iVar1 = Vec_PtrSize(p);
  if (iVar1 == 0) {
    pManMR->fSolutionIsDc = 1;
  }
  else {
    pManMR->fSolutionIsDc = 0;
    pAVar3 = Abc_NtkCreateNodeAnd(pManMR->pInitNtk,p);
    pAVar4 = Abc_NtkCreatePo(pManMR->pInitNtk);
    Abc_ObjAddFanin(pAVar4,pAVar3);
    Vec_PtrFree(p);
  }
  return;
}

Assistant:

void Abc_FlowRetime_SetupBackwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pLatch, *pObj, *pPi;
  int i;
  Vec_Ptr_t *vObj = Vec_PtrAlloc(100);

  // create the network used for the initial state computation
  if (Abc_NtkIsStrash(pNtk)) {
    pManMR->pInitNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
  } else if (Abc_NtkHasMapping(pNtk))
    pManMR->pInitNtk = Abc_NtkAlloc( pNtk->ntkType, ABC_FUNC_SOP, 1 );
  else
    pManMR->pInitNtk = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );

  // mitre inputs
  Abc_NtkForEachLatch( pNtk, pLatch, i ) {
    // map latch to initial state network
    pPi = Abc_NtkCreatePi( pManMR->pInitNtk );

    // DEBUG
    // printf("setup : mapping latch %d to PI %d\n", pLatch->Id, pPi->Id);

    // has initial state requirement?
    if (Abc_LatchIsInit0(pLatch)) {
      pObj = Abc_NtkCreateNodeInv( pManMR->pInitNtk, pPi );
      Vec_PtrPush(vObj, pObj);
    }
    else if (Abc_LatchIsInit1(pLatch)) {
      Vec_PtrPush(vObj, pPi);
    }
    
    Abc_ObjSetData( pLatch, pPi );     // if not verifying init state
    // FDATA(pLatch)->pInitObj = pPi;  // if verifying init state
  }

  // are there any nodes not DC?
  if (!Vec_PtrSize(vObj)) {
    pManMR->fSolutionIsDc = 1;
    return;
  } else 
    pManMR->fSolutionIsDc = 0;

  // mitre output

  // create n-input AND gate
  pObj = Abc_NtkCreateNodeAnd( pManMR->pInitNtk, vObj );

  Abc_ObjAddFanin( Abc_NtkCreatePo( pManMR->pInitNtk ), pObj );

  Vec_PtrFree( vObj );
}